

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O1

void __thiscall slang::SVInt::setAllZ(SVInt *this)

{
  uint uVar1;
  int iVar2;
  uint64_t *puVar3;
  ulong uVar4;
  
  if ((this->super_SVIntStorage).unknownFlag == false) {
    if ((0x40 < (this->super_SVIntStorage).bitWidth) &&
       (puVar3 = (this->super_SVIntStorage).field_0.pVal, puVar3 != (uint64_t *)0x0)) {
      operator_delete__(puVar3);
    }
    (this->super_SVIntStorage).unknownFlag = true;
    puVar3 = (uint64_t *)
             operator_new__((ulong)((this->super_SVIntStorage).bitWidth + 0x3f >> 2 & 0xfffffff0));
    (this->super_SVIntStorage).field_0.pVal = puVar3;
  }
  uVar1 = (this->super_SVIntStorage).bitWidth + 0x3f;
  if (0x3f < uVar1) {
    iVar2 = (uVar1 >> 6) << ((this->super_SVIntStorage).unknownFlag & 0x1fU);
    uVar4 = 0;
    do {
      (this->super_SVIntStorage).field_0.pVal[uVar4] = 0xffffffffffffffff;
      uVar4 = uVar4 + 1;
    } while (iVar2 + (uint)(iVar2 == 0) != uVar4);
  }
  clearUnusedBits(this);
  return;
}

Assistant:

void SVInt::setAllZ() {
    if (!unknownFlag) {
        if (!isSingleWord())
            delete[] pVal;

        unknownFlag = true;
        pVal = new uint64_t[getNumWords()];
    }

    // everything set to 1 (for Z in the low half and for unknown in the upper half)
    for (uint32_t i = 0; i < getNumWords(); i++)
        pVal[i] = UINT64_MAX;
    clearUnusedBits();
}